

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall tetgenmesh::removeedgebyflips(tetgenmesh *this,triface *flipedge,flipconstraints *fc)

{
  tetrahedron *pppdVar1;
  int iVar2;
  tetrahedron *pppdVar3;
  long lVar4;
  uint nn;
  triface *abtets;
  tetrahedron *pppdVar5;
  triface *ptVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  int *piVar10;
  face checkseg;
  face *paryseg;
  
  pppdVar3 = flipedge->tet;
  if (((this->checksubsegflag == 0) || (pppdVar3[8] == (tetrahedron)0x0)) ||
     (pppdVar3[8][ver2edge[flipedge->ver]] == (double *)0x0)) {
    piVar10 = &flipedge->ver;
    lVar9 = 0;
    uVar8 = 0;
    pppdVar5 = pppdVar3;
    piVar7 = piVar10;
    do {
      pppdVar1 = pppdVar5 + facepivot1[*piVar7];
      pppdVar5 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
      piVar7 = facepivot2[*piVar7] + ((uint)*pppdVar1 & 0xf);
      uVar8 = uVar8 - 1;
      lVar9 = lVar9 + -0x10;
    } while (pppdVar3 != pppdVar5);
    if (0xfffffffd < uVar8) {
      terminatetetgen(this,2);
    }
    iVar2 = this->b->flipstarsize;
    nn = 0;
    if ((int)~uVar8 < iVar2 || iVar2 < 1) {
      abtets = (triface *)operator_new__(-lVar9);
      ptVar6 = abtets;
      do {
        ptVar6->tet = (tetrahedron *)0x0;
        ptVar6->ver = 0;
        ptVar6 = ptVar6 + 1;
      } while ((triface *)((long)abtets - lVar9) != ptVar6);
      pppdVar3 = flipedge->tet;
      piVar7 = &abtets->ver;
      pppdVar5 = pppdVar3;
      do {
        iVar2 = *piVar10;
        ((triface *)(piVar7 + -2))->tet = pppdVar5;
        *piVar7 = iVar2;
        *(undefined2 *)((long)pppdVar5 + (long)this->elemmarkerindex * 4 + 2) = 1;
        pppdVar1 = pppdVar5 + facepivot1[iVar2];
        pppdVar5 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
        piVar10 = facepivot2[iVar2] + ((uint)*pppdVar1 & 0xf);
        piVar7 = piVar7 + 4;
      } while (pppdVar3 != pppdVar5);
      nn = flipnm(this,abtets,-uVar8,0,0,fc);
      if (2 < (int)nn) {
        for (lVar9 = 0; (ulong)nn << 4 != lVar9; lVar9 = lVar9 + 0x10) {
          lVar4 = *(long *)((long)&abtets->tet + lVar9);
          *(uint *)(lVar4 + (long)this->elemmarkerindex * 4) =
               (uint)*(ushort *)(lVar4 + (long)this->elemmarkerindex * 4);
        }
        flipedge->tet = abtets->tet;
        flipedge->ver = abtets->ver;
      }
      iVar2 = fc->unflip;
      fc->unflip = 0;
      flipnm_post(this,abtets,-uVar8,nn,0,fc);
      fc->unflip = iVar2;
      operator_delete__(abtets);
    }
  }
  else {
    nn = 0;
    if (fc->collectencsegflag != 0) {
      checkseg.sh = (shellface *)0x0;
      checkseg.shver = 0;
      tsspivot1(this,flipedge,&checkseg);
      uVar8 = *(uint *)((long)checkseg.sh + (long)this->shmarkindex * 4 + 4);
      if ((uVar8 & 1) == 0) {
        *(uint *)((long)checkseg.sh + (long)this->shmarkindex * 4 + 4) = uVar8 | 1;
        arraypool::newindex(this->caveencseglist,&paryseg);
        paryseg->sh = checkseg.sh;
        paryseg->shver = checkseg.shver;
      }
      nn = 0;
    }
  }
  return nn;
}

Assistant:

int tetgenmesh::removeedgebyflips(triface *flipedge, flipconstraints* fc)
{
  triface *abtets, spintet;
  int t1ver; 
  int n, nn, i;


  if (checksubsegflag) {
    // Do not flip a segment.
    if (issubseg(*flipedge)) {
      if (fc->collectencsegflag) {
        face checkseg, *paryseg;
        tsspivot1(*flipedge, checkseg);
        if (!sinfected(checkseg)) {
          // Queue this segment in list.
          sinfect(checkseg);                
          caveencseglist->newindex((void **) &paryseg);
          *paryseg = checkseg;
        }
      }
      return 0;
    }
  }

  // Count the number of tets at edge [a,b].
  n = 0;
  spintet = *flipedge;
  while (1) {
    n++;
    fnextself(spintet);
    if (spintet.tet == flipedge->tet) break;
  }
  if (n < 3) {
    // It is only possible when the mesh contains inverted tetrahedra.  
    terminatetetgen(this, 2); // Report a bug
  }

  if ((b->flipstarsize > 0) && (n > b->flipstarsize)) {
    // The star size exceeds the limit.
    return 0; // Do not flip it.
  }

  // Allocate spaces.
  abtets = new triface[n];
  // Collect the tets at edge [a,b].
  spintet = *flipedge;
  i = 0;
  while (1) {
    abtets[i] = spintet;
    setelemcounter(abtets[i], 1); 
    i++;
    fnextself(spintet);
    if (spintet.tet == flipedge->tet) break;
  }


  // Try to flip the edge (level = 0, edgepivot = 0).
  nn = flipnm(abtets, n, 0, 0, fc);


  if (nn > 2) {
    // Edge is not flipped. Unmarktest the remaining tets in Star(ab).
    for (i = 0; i < nn; i++) {
      setelemcounter(abtets[i], 0);
    }
    // Restore the input edge (needed by Lawson's flip).
    *flipedge = abtets[0];
  }

  // Release the temporary allocated spaces.
  // NOTE: fc->unflip must be 0.
  int bakunflip = fc->unflip;
  fc->unflip = 0;
  flipnm_post(abtets, n, nn, 0, fc);
  fc->unflip = bakunflip;

  delete [] abtets;

  return nn; 
}